

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O2

bool __thiscall
cmCMakeHostSystemInformationCommand::InitialPass
          (cmCMakeHostSystemInformationCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  SystemInformation info;
  string result_list;
  string value;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x21) ||
     (bVar3 = std::operator!=(__lhs,"RESULT"), bVar3)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result_list,"missing RESULT specification.",(allocator<char> *)&value);
    cmCommand::SetError(&this->super_cmCommand,&result_list);
  }
  else {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((0x7f < (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) &&
       (bVar3 = std::operator!=(pbVar1 + 2,"QUERY"), !bVar3)) {
      cmsys::SystemInformation::SystemInformation(&info);
      cmsys::SystemInformation::RunCPUCheck(&info);
      cmsys::SystemInformation::RunOSCheck(&info);
      cmsys::SystemInformation::RunMemoryCheck(&info);
      result_list._M_dataplus._M_p = (pointer)&result_list.field_2;
      result_list._M_string_length = 0;
      result_list.field_2._M_local_buf[0] = '\0';
      uVar6 = 3;
      lVar5 = 0x60;
      do {
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar3 = (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
                uVar6;
        if (bVar3) {
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,pbVar1 + 1,result_list._M_dataplus._M_p);
LAB_0018b029:
          std::__cxx11::string::~string((string *)&result_list);
          cmsys::SystemInformation::~SystemInformation(&info);
          return bVar3;
        }
        if (uVar6 != 3) {
          std::__cxx11::string::append((char *)&result_list);
        }
        value._M_dataplus._M_p = (pointer)&value.field_2;
        value._M_string_length = 0;
        value.field_2._M_local_buf[0] = '\0';
        bVar4 = GetValue(this,&info,(string *)((long)&(pbVar2->_M_dataplus)._M_p + lVar5),&value);
        if (!bVar4) {
          std::__cxx11::string::~string((string *)&value);
          goto LAB_0018b029;
        }
        std::__cxx11::string::append((string *)&result_list);
        std::__cxx11::string::~string((string *)&value);
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x20;
      } while( true );
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result_list,"missing QUERY specification",(allocator<char> *)&value);
    cmCommand::SetError(&this->super_cmCommand,&result_list);
  }
  std::__cxx11::string::~string((string *)&result_list);
  return false;
}

Assistant:

bool cmCMakeHostSystemInformationCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  size_t current_index = 0;

  if (args.size() < (current_index + 2) || args[current_index] != "RESULT") {
    this->SetError("missing RESULT specification.");
    return false;
  }

  std::string const& variable = args[current_index + 1];
  current_index += 2;

  if (args.size() < (current_index + 2) || args[current_index] != "QUERY") {
    this->SetError("missing QUERY specification");
    return false;
  }

  cmsys::SystemInformation info;
  info.RunCPUCheck();
  info.RunOSCheck();
  info.RunMemoryCheck();

  std::string result_list;
  for (size_t i = current_index + 1; i < args.size(); ++i) {
    std::string const& key = args[i];
    if (i != current_index + 1) {
      result_list += ";";
    }
    std::string value;
    if (!this->GetValue(info, key, value)) {
      return false;
    }
    result_list += value;
  }

  this->Makefile->AddDefinition(variable, result_list.c_str());

  return true;
}